

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

void Curl_resolv_unlink(Curl_easy *data,Curl_dns_entry **pdns)

{
  size_t *psVar1;
  Curl_dns_entry *pCVar2;
  Curl_dns_entry *dns;
  
  pCVar2 = *pdns;
  *pdns = (Curl_dns_entry *)0x0;
  if (data == (Curl_easy *)0x0) {
    psVar1 = &pCVar2->refcount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      Curl_freeaddrinfo(pCVar2->addr);
      (*Curl_cfree)(pCVar2);
      return;
    }
  }
  else {
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    psVar1 = &pCVar2->refcount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      Curl_freeaddrinfo(pCVar2->addr);
      (*Curl_cfree)(pCVar2);
    }
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      return;
    }
  }
  return;
}

Assistant:

void Curl_resolv_unlink(struct Curl_easy *data, struct Curl_dns_entry **pdns)
{
  struct Curl_dns_entry *dns = *pdns;
  *pdns = NULL;
  if(data && data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  hostcache_unlink_entry(dns);

  if(data && data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
}